

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcflow.cpp
# Opt level: O1

void __thiscall Arcflow::relabel_graph(Arcflow *this,vector<int,_std::allocator<int>_> *labels)

{
  int iVar1;
  int iVar2;
  pointer pAVar3;
  pointer piVar4;
  pointer pAVar5;
  int *piVar6;
  set<Arc,_std::less<Arc>,_std::allocator<Arc>_> arcs;
  Arc local_6c;
  _Rb_tree<Arc,_Arc,_std::_Identity<Arc>,_std::less<Arc>,_std::allocator<Arc>_> local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  pAVar5 = (this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pAVar3 = (this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (pAVar5 != pAVar3) {
    piVar6 = &pAVar5->label;
    do {
      piVar4 = (labels->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      iVar1 = piVar4[((Arc *)(piVar6 + -2))->u];
      iVar2 = piVar4[piVar6[-1]];
      if (iVar1 != iVar2) {
        local_6c.label = *piVar6;
        local_6c.u = iVar1;
        local_6c.v = iVar2;
        std::_Rb_tree<Arc,_Arc,_std::_Identity<Arc>,_std::less<Arc>,_std::allocator<Arc>_>::
        _M_insert_unique<Arc>(&local_60,&local_6c);
      }
      pAVar5 = (pointer)(piVar6 + 1);
      piVar6 = piVar6 + 3;
    } while (pAVar5 != pAVar3);
  }
  std::vector<Arc,std::allocator<Arc>>::_M_assign_aux<std::_Rb_tree_const_iterator<Arc>>
            ((vector<Arc,std::allocator<Arc>> *)&this->A,
             local_60._M_impl.super__Rb_tree_header._M_header._M_left,
             &local_60._M_impl.super__Rb_tree_header);
  std::_Rb_tree<Arc,_Arc,_std::_Identity<Arc>,_std::less<Arc>,_std::allocator<Arc>_>::~_Rb_tree
            (&local_60);
  return;
}

Assistant:

void Arcflow::relabel_graph(const std::vector<int> &labels) {
	std::set<Arc> arcs;
	for (const Arc &a : A) {
		int u = labels[a.u];
		int v = labels[a.v];
		if (u != v) {
			arcs.insert(Arc(u, v, a.label));
		}
	}
	A.assign(all(arcs));
}